

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O2

void __thiscall despot::ParticleBelief::~ParticleBelief(ParticleBelief *this)

{
  pointer ppSVar1;
  DSPOMDP *pDVar2;
  int i;
  ulong uVar3;
  
  (this->super_Belief)._vptr_Belief = (_func_int **)&PTR__ParticleBelief_0019b148;
  uVar3 = 0;
  while( true ) {
    ppSVar1 = (this->particles_).
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->particles_).
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar3) break;
    pDVar2 = (this->super_Belief).model_;
    (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,ppSVar1[uVar3]);
    uVar3 = uVar3 + 1;
  }
  uVar3 = 0;
  while( true ) {
    ppSVar1 = (this->initial_particles_).
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->initial_particles_).
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar3) break;
    pDVar2 = (this->super_Belief).model_;
    (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,ppSVar1[uVar3]);
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&(this->initial_particles_).
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&(this->particles_).
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  Belief::~Belief(&this->super_Belief);
  return;
}

Assistant:

ParticleBelief::~ParticleBelief() {
	for (int i = 0; i < particles_.size(); i++) {
		model_->Free(particles_[i]);
	}

	for (int i = 0; i < initial_particles_.size(); i++) {
		model_->Free(initial_particles_[i]);
	}
}